

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O2

void chapter3::vector_sort(void)

{
  ostream *poVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  ifstream ifile;
  byte abStack_1f0 [488];
  
  std::ifstream::ifstream(&ifile,"/tmp/a.txt",_S_in);
  if ((abStack_1f0[*(long *)(_ifile + -0x18)] & 5) == 0) {
    vec.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vec.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vec.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    file_to_vector(&vec,&ifile);
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<chapter3::LessThan>>
              (vec.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               vec.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    display_vector<std::__cxx11::string>(&vec,(ostream *)&std::cout,8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vec);
    std::ifstream::~ifstream(&ifile);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Oops! Cant\'t open the input file.");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

void chapter3::vector_sort() {
    // read file
    ifstream ifile("/tmp/a.txt");
    if (!ifile) {
        cerr << "Oops! Cant't open the input file." << endl;
        exit(1);
    }

    vector<string> vec;
    file_to_vector(vec, ifile);

    sort(vec.begin(), vec.end(), LessThan());
    display_vector(vec);
}